

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_ldm_gear_feed(ldmRollingHashState_t *state,BYTE *data,size_t size,size_t *splits,
                         uint *numSplits)

{
  ulong uVar1;
  size_t sVar2;
  U64 mask;
  U64 hash;
  size_t n;
  uint *numSplits_local;
  size_t *splits_local;
  size_t size_local;
  BYTE *data_local;
  ldmRollingHashState_t *state_local;
  
  hash = state->rolling;
  uVar1 = state->stopMask;
  n = 0;
  do {
    do {
      if (size <= n + 3) goto LAB_0027ab2c;
      hash = hash * 2 + ZSTD_ldm_gearTab[(int)(uint)data[n]];
      sVar2 = n + 1;
      if ((hash & uVar1) == 0) {
        splits[*numSplits] = sVar2;
        *numSplits = *numSplits + 1;
        if (*numSplits == 0x40) goto LAB_0027abd1;
      }
      hash = hash * 2 + ZSTD_ldm_gearTab[(int)(uint)data[sVar2]];
      sVar2 = n + 2;
      if ((hash & uVar1) == 0) {
        splits[*numSplits] = sVar2;
        *numSplits = *numSplits + 1;
        if (*numSplits == 0x40) goto LAB_0027abd1;
      }
      hash = hash * 2 + ZSTD_ldm_gearTab[(int)(uint)data[sVar2]];
      sVar2 = n + 3;
      if ((hash & uVar1) == 0) {
        splits[*numSplits] = sVar2;
        *numSplits = *numSplits + 1;
        if (*numSplits == 0x40) goto LAB_0027abd1;
      }
      hash = hash * 2 + ZSTD_ldm_gearTab[(int)(uint)data[sVar2]];
      n = n + 4;
    } while ((hash & uVar1) != 0);
    splits[*numSplits] = n;
    *numSplits = *numSplits + 1;
    sVar2 = n;
  } while (*numSplits != 0x40);
  goto LAB_0027abd1;
  while( true ) {
    splits[*numSplits] = n;
    *numSplits = *numSplits + 1;
    sVar2 = n;
    if (*numSplits == 0x40) break;
LAB_0027ab2c:
    do {
      sVar2 = n;
      if (size <= n) goto LAB_0027abd1;
      hash = hash * 2 + ZSTD_ldm_gearTab[(int)(uint)data[n]];
      n = n + 1;
    } while ((hash & uVar1) != 0);
  }
LAB_0027abd1:
  n = sVar2;
  state->rolling = hash;
  return n;
}

Assistant:

static size_t ZSTD_ldm_gear_feed(ldmRollingHashState_t* state,
                                 BYTE const* data, size_t size,
                                 size_t* splits, unsigned* numSplits)
{
    size_t n;
    U64 hash, mask;

    hash = state->rolling;
    mask = state->stopMask;
    n = 0;

#define GEAR_ITER_ONCE() do { \
        hash = (hash << 1) + ZSTD_ldm_gearTab[data[n] & 0xff]; \
        n += 1; \
        if (UNLIKELY((hash & mask) == 0)) { \
            splits[*numSplits] = n; \
            *numSplits += 1; \
            if (*numSplits == LDM_BATCH_SIZE) \
                goto done; \
        } \
    } while (0)

    while (n + 3 < size) {
        GEAR_ITER_ONCE();
        GEAR_ITER_ONCE();
        GEAR_ITER_ONCE();
        GEAR_ITER_ONCE();
    }
    while (n < size) {
        GEAR_ITER_ONCE();
    }

#undef GEAR_ITER_ONCE

done:
    state->rolling = hash;
    return n;
}